

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O1

void __thiscall
Fifteen::drawNumberOnTile
          (Fifteen *this,QIcon *icon,QPixmap *pixmap,size_t fontSize,size_t number,
          NumberColor numberColor)

{
  int *piVar1;
  QByteArrayView QVar2;
  QPainter painter;
  undefined1 local_70 [14];
  undefined2 uStack_62;
  int iStack_60;
  undefined2 uStack_5c;
  undefined2 uStack_5a;
  undefined8 local_58;
  QFont local_50 [16];
  QRect local_40;
  undefined8 local_30;
  
  QPainter::QPainter((QPainter *)local_70,(QPaintDevice *)pixmap);
  QVar2.m_data = (storage_type *)0x5;
  QVar2.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar2);
  local_70._8_4_ = local_40.x1;
  local_70._12_2_ = (undefined2)local_40.y1;
  uStack_62 = local_40.y1._2_2_;
  iStack_60 = local_40.x2;
  uStack_5c = (undefined2)local_40.y2;
  uStack_5a = local_40.y2._2_2_;
  local_58 = local_30;
  QFont::QFont(local_50,(QString *)(local_70 + 8),(int)fontSize,700,false);
  QPainter::setFont((QFont *)local_70);
  QFont::~QFont(local_50);
  piVar1 = (int *)CONCAT26(uStack_62,CONCAT24(local_70._12_2_,local_70._8_4_));
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT26(uStack_62,CONCAT24(local_70._12_2_,local_70._8_4_)),2,8);
    }
  }
  local_70._8_4_ = 1;
  if (numberColor == WHITE) {
    uStack_62 = 0xffff;
    iStack_60 = 0xffffffff;
  }
  else {
    uStack_62 = 0;
    iStack_60 = 0;
  }
  uStack_5c = 0;
  local_70._12_2_ = 0xffff;
  QPainter::setPen((QColor *)local_70);
  local_50 = (QFont  [16])QPixmap::rect();
  QString::number((ulong)&local_40,(int)number + 1);
  QPainter::drawText((QRect *)local_70,(int)local_50,(QString *)0x84,&local_40);
  if ((QArrayData *)local_40._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_40._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_40._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_40._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_40._0_8_,2,8);
    }
  }
  QIcon::addPixmap(icon,pixmap,0,1);
  QPainter::end();
  QPainter::~QPainter((QPainter *)local_70);
  return;
}

Assistant:

void Fifteen::drawNumberOnTile( QIcon& icon, QPixmap& pixmap, size_t fontSize, size_t number, NumberColor numberColor )
{
    QPainter painter( &pixmap );
    painter.setFont( QFont( "Times", fontSize, QFont::Bold ));
    QColor color = numberColor == NumberColor::WHITE ? QColor( 255, 255, 255 ) : QColor( 0, 0, 0 );
    painter.setPen( color );
    painter.drawText( pixmap.rect(), Qt::AlignCenter, QString::number( number + 1 ));
    icon.addPixmap( pixmap );
    painter.end();
}